

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FxchDiv.c
# Opt level: O3

void Fxch_DivPrint(Fxch_Man_t *pFxchMan,int iDiv)

{
  int *piVar1;
  uint uVar2;
  Hsh_VecMan_t *pHVar3;
  ulong uVar4;
  int iVar5;
  long lVar6;
  
  if (-1 < iDiv) {
    uVar4 = (ulong)(uint)iDiv;
    pHVar3 = pFxchMan->pDivHash;
    if (iDiv < pHVar3->vMap->nSize) {
      iVar5 = pHVar3->vMap->pArray[uVar4];
      if (((long)iVar5 < 0) || (pHVar3->vData->nSize <= iVar5)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
      }
      piVar1 = pHVar3->vData->pArray + iVar5;
      iVar5 = *piVar1;
      (pHVar3->vTemp).nCap = iVar5;
      (pHVar3->vTemp).nSize = iVar5;
      (pHVar3->vTemp).pArray = piVar1 + 2;
      printf("Div %7d : ",uVar4);
      if (pFxchMan->vDivWeights->nSize <= iDiv) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecFlt.h"
                      ,0x16e,"float Vec_FltEntry(Vec_Flt_t *, int)");
      }
      printf("Weight %12.5f  ",(double)pFxchMan->vDivWeights->pArray[uVar4]);
      iVar5 = (pHVar3->vTemp).nSize;
      if (0 < iVar5) {
        lVar6 = 0;
        do {
          uVar2 = (pHVar3->vTemp).pArray[lVar6];
          if ((int)uVar2 < 0) goto LAB_004c5e3e;
          if ((uVar2 & 1) == 0) {
            printf("%d(1)",(ulong)(uVar2 >> 1));
            iVar5 = (pHVar3->vTemp).nSize;
          }
          lVar6 = lVar6 + 1;
        } while (lVar6 < iVar5);
      }
      printf(" + ");
      iVar5 = (pHVar3->vTemp).nSize;
      if (0 < iVar5) {
        lVar6 = 0;
        do {
          uVar2 = (pHVar3->vTemp).pArray[lVar6];
          if ((int)uVar2 < 0) {
LAB_004c5e3e:
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                          ,0x130,"int Abc_LitIsCompl(int)");
          }
          if ((uVar2 & 1) != 0) {
            printf("%d(2)",(ulong)(uVar2 >> 1));
            iVar5 = (pHVar3->vTemp).nSize;
          }
          lVar6 = lVar6 + 1;
        } while (lVar6 < iVar5);
      }
      printf(" Lits =%7d  ",(ulong)(uint)pFxchMan->nLits);
      printf("Divs =%8d  \n",(ulong)(uint)pFxchMan->pDivHash->vMap->nSize);
      return;
    }
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

void Fxch_DivPrint( Fxch_Man_t* pFxchMan,
                    int iDiv )
{
    Vec_Int_t* vDiv = Hsh_VecReadEntry( pFxchMan->pDivHash, iDiv );
    int i,
        Lit;

    printf( "Div %7d : ", iDiv );
    printf( "Weight %12.5f  ", Vec_FltEntry( pFxchMan->vDivWeights, iDiv ) );

    Vec_IntForEachEntry( vDiv, Lit, i )
        if ( !Abc_LitIsCompl( Lit ) )
            printf( "%d(1)", Abc_Lit2Var( Lit ) );

    printf( " + " );

    Vec_IntForEachEntry( vDiv, Lit, i )
        if ( Abc_LitIsCompl( Lit ) )
            printf( "%d(2)", Abc_Lit2Var( Lit ) );

    printf( " Lits =%7d  ", pFxchMan->nLits );
    printf( "Divs =%8d  \n", Hsh_VecSize( pFxchMan->pDivHash ) );
}